

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

int av1_selfguided_restoration_c
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_stack_00000010;
  sgr_params_type *params;
  int j_1;
  int i_1;
  int j;
  int i;
  uint16_t *dgd16;
  int32_t *dgd32;
  int dgd32_stride;
  int32_t dgd32_ [8100];
  int local_7ee0;
  int local_7edc;
  int local_7ed8;
  int local_7ed4;
  uint auStack_7eac [8107];
  
  iVar1 = in_ESI + 6;
  if ((int)params == 0) {
    for (local_7edc = -3; local_7edc < in_EDX + 3; local_7edc = local_7edc + 1) {
      for (local_7ee0 = -3; local_7ee0 < in_ESI + 3; local_7ee0 = local_7ee0 + 1) {
        auStack_7eac[(long)(iVar1 * 3) + (long)(local_7edc * iVar1 + local_7ee0)] =
             (uint)*(byte *)(in_RDI + (local_7edc * in_ECX + local_7ee0));
      }
    }
  }
  else {
    for (local_7ed4 = -3; local_7ed4 < in_EDX + 3; local_7ed4 = local_7ed4 + 1) {
      for (local_7ed8 = -3; local_7ed8 < in_ESI + 3; local_7ed8 = local_7ed8 + 1) {
        auStack_7eac[(long)(iVar1 * 3) + (long)(local_7ed4 * iVar1 + local_7ed8)] =
             (uint)*(ushort *)(in_RDI * 2 + (long)(local_7ed4 * in_ECX + local_7ed8) * 2);
      }
    }
  }
  if (0 < av1_sgr_params[in_stack_00000010].r[0]) {
    selfguided_restoration_fast_internal
              ((int32_t *)CONCAT44(dgd32_[0x1f9d],dgd32_[0x1f9c]),dgd32_[0x1f9b],dgd32_[0x1f9a],
               dgd32_[0x1f99],(int32_t *)dgd32_._32344_8_,dgd32_[0x1f95],dgd32_[0x1fa0],
               dgd32_[0x1fa2],(int)flt1);
  }
  if (0 < av1_sgr_params[in_stack_00000010].r[1]) {
    selfguided_restoration_internal
              ((int32_t *)dgd32_._32328_8_,dgd32_[0x1f91],dgd32_[0x1f90],dgd32_[0x1f8f],
               (int32_t *)dgd32_._32304_8_,dgd32_[0x1f8b],dgd32_[0x1f98],dgd32_[0x1f9a],
               dgd32_[0x1f9c]);
  }
  return 0;
}

Assistant:

int av1_selfguided_restoration_c(const uint8_t *dgd8, int width, int height,
                                 int dgd_stride, int32_t *flt0, int32_t *flt1,
                                 int flt_stride, int sgr_params_idx,
                                 int bit_depth, int highbd) {
  int32_t dgd32_[RESTORATION_PROC_UNIT_PELS];
  const int dgd32_stride = width + 2 * SGRPROJ_BORDER_HORZ;
  int32_t *dgd32 =
      dgd32_ + dgd32_stride * SGRPROJ_BORDER_VERT + SGRPROJ_BORDER_HORZ;

  if (highbd) {
    const uint16_t *dgd16 = CONVERT_TO_SHORTPTR(dgd8);
    for (int i = -SGRPROJ_BORDER_VERT; i < height + SGRPROJ_BORDER_VERT; ++i) {
      for (int j = -SGRPROJ_BORDER_HORZ; j < width + SGRPROJ_BORDER_HORZ; ++j) {
        dgd32[i * dgd32_stride + j] = dgd16[i * dgd_stride + j];
      }
    }
  } else {
    for (int i = -SGRPROJ_BORDER_VERT; i < height + SGRPROJ_BORDER_VERT; ++i) {
      for (int j = -SGRPROJ_BORDER_HORZ; j < width + SGRPROJ_BORDER_HORZ; ++j) {
        dgd32[i * dgd32_stride + j] = dgd8[i * dgd_stride + j];
      }
    }
  }

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));

  if (params->r[0] > 0)
    selfguided_restoration_fast_internal(dgd32, width, height, dgd32_stride,
                                         flt0, flt_stride, bit_depth,
                                         sgr_params_idx, 0);
  if (params->r[1] > 0)
    selfguided_restoration_internal(dgd32, width, height, dgd32_stride, flt1,
                                    flt_stride, bit_depth, sgr_params_idx, 1);
  return 0;
}